

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_checkbox_flags_text(nk_context *ctx,char *text,int len,uint *flags,uint value)

{
  uint uVar1;
  nk_bool nVar2;
  uint *in_RCX;
  undefined4 in_EDX;
  nk_context *in_RSI;
  long in_RDI;
  uint in_R8D;
  nk_bool active;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RSI == (nk_context *)0x0)) || (in_RCX == (uint *)0x0)) {
    local_4 = 0;
  }
  else {
    uVar1 = *in_RCX & in_R8D & in_R8D;
    nVar2 = nk_checkbox_text(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                             (int)((ulong)in_RCX >> 0x20),(nk_bool *)CONCAT44(in_R8D,uVar1));
    if (nVar2 == 0) {
      local_4 = 0;
    }
    else {
      if (uVar1 == 0) {
        *in_RCX = (in_R8D ^ 0xffffffff) & *in_RCX;
      }
      else {
        *in_RCX = in_R8D | *in_RCX;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_checkbox_flags_text(struct nk_context *ctx, const char *text, int len,
unsigned int *flags, unsigned int value)
{
nk_bool active;
NK_ASSERT(ctx);
NK_ASSERT(text);
NK_ASSERT(flags);
if (!ctx || !text || !flags) return 0;

active = (int)((*flags & value) & value);
if (nk_checkbox_text(ctx, text, len, &active)) {
if (active) *flags |= value;
else *flags &= ~value;
return 1;
}
return 0;
}